

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O0

string * __thiscall
solitaire::cards::to_string_abi_cxx11_(string *__return_storage_ptr__,cards *this,Value *value)

{
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  cards *local_18;
  Value *value_local;
  
  local_18 = this;
  value_local = (Value *)__return_storage_ptr__;
  switch(*(undefined4 *)this) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Ace",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Two",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Three",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Four",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Five",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Six",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Seven",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Eight",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Nine",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Ten",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Jack",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Queen",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"King",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const Value& value) {
    switch(value) {
        case Value::Ace:
            return "Ace";
        case Value::Two:
            return "Two";
        case Value::Three:
            return "Three";
        case Value::Four:
            return "Four";
        case Value::Five:
            return "Five";
        case Value::Six:
            return "Six";
        case Value::Seven:
            return "Seven";
        case Value::Eight:
            return "Eight";
        case Value::Nine:
            return "Nine";
        case Value::Ten:
            return "Ten";
        case Value::Jack:
            return "Jack";
        case Value::Queen:
            return "Queen";
        case Value::King:
            return "King";
        default:
            return "Unknown";
    }
}